

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::MethodDescriptor::CopyTo(MethodDescriptor *this,MethodDescriptorProto *proto)

{
  Descriptor *pDVar1;
  string *psVar2;
  MethodOptions *pMVar3;
  MethodOptions *pMVar4;
  
  MethodDescriptorProto::set_name(proto,*(string **)this);
  pDVar1 = internal::LazyDescriptor::Get((LazyDescriptor *)(this + 0x18));
  if (pDVar1[0x29] == (Descriptor)0x0) {
    MethodDescriptorProto::set_input_type(proto,".");
  }
  psVar2 = MethodDescriptorProto::mutable_input_type_abi_cxx11_(proto);
  internal::LazyDescriptor::Get((LazyDescriptor *)(this + 0x18));
  std::__cxx11::string::append((string *)psVar2);
  pDVar1 = internal::LazyDescriptor::Get((LazyDescriptor *)(this + 0x38));
  if (pDVar1[0x29] == (Descriptor)0x0) {
    MethodDescriptorProto::set_output_type(proto,".");
  }
  psVar2 = MethodDescriptorProto::mutable_output_type_abi_cxx11_(proto);
  internal::LazyDescriptor::Get((LazyDescriptor *)(this + 0x38));
  std::__cxx11::string::append((string *)psVar2);
  pMVar4 = *(MethodOptions **)(this + 0x58);
  pMVar3 = MethodOptions::default_instance();
  if (pMVar4 != pMVar3) {
    pMVar4 = MethodDescriptorProto::mutable_options(proto);
    MethodOptions::CopyFrom(pMVar4,*(MethodOptions **)(this + 0x58));
  }
  if (this[0x60] == (MethodDescriptor)0x1) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 0x10;
    proto->client_streaming_ = true;
  }
  if (this[0x61] == (MethodDescriptor)0x1) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 0x20;
    proto->server_streaming_ = true;
  }
  return;
}

Assistant:

void MethodDescriptor::CopyTo(MethodDescriptorProto* proto) const {
  proto->set_name(name());

  if (!input_type()->is_unqualified_placeholder_) {
    proto->set_input_type(".");
  }
  proto->mutable_input_type()->append(input_type()->full_name());

  if (!output_type()->is_unqualified_placeholder_) {
    proto->set_output_type(".");
  }
  proto->mutable_output_type()->append(output_type()->full_name());

  if (&options() != &MethodOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }

  if (client_streaming_) {
    proto->set_client_streaming(true);
  }
  if (server_streaming_) {
    proto->set_server_streaming(true);
  }
}